

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionManager.cpp
# Opt level: O2

Molecule * __thiscall
OpenMD::SelectionManager::beginUnselectedMolecule(SelectionManager *this,int *i)

{
  int iVar1;
  Molecule *pMVar2;
  
  iVar1 = OpenMDBitSet::firstOffBit
                    ((this->ss_).bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start + 5);
  *i = iVar1;
  if (iVar1 == -1) {
    pMVar2 = (Molecule *)0x0;
  }
  else {
    pMVar2 = (this->molecules_).
             super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
             super__Vector_impl_data._M_start[iVar1];
  }
  return pMVar2;
}

Assistant:

Molecule* SelectionManager::beginUnselectedMolecule(int& i) {
#ifdef IS_MPI
    i = 0;
    while (i < static_cast<int>(ss_.bitsets_[MOLECULE].size())) {
      if (!ss_.bitsets_[MOLECULE][i]) {
        // check that this processor owns this molecule
        if (molecules_[i] != NULL) return molecules_[i];
      }
      ++i;
    }
    return NULL;
#else
    i = ss_.bitsets_[MOLECULE].firstOffBit();
    return i == -1 ? NULL : molecules_[i];
#endif
  }